

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void discrete_dist_test_pdf<trng::hypergeometric_dist>(hypergeometric_dist *d)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  double diff;
  AssertionHandler catchAssertionHandler;
  double local_f0;
  long local_e8;
  long local_e0;
  double local_d8;
  undefined8 local_d0;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  double *local_a8;
  char *local_a0;
  size_t sStack_98;
  undefined8 *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  iVar1 = (d->P).x_min;
  if ((d->P).x_max < iVar1) {
    local_f0 = 1.0;
  }
  else {
    local_f0 = *(d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (local_f0 < 0.95) {
    local_e0 = (long)iVar1;
    local_e8 = local_e0 * 8;
    lVar7 = 0;
    do {
      iVar4 = (int)lVar7;
      iVar6 = iVar1 + iVar4;
      iVar2 = (d->P).x_min;
      if (iVar2 < iVar6) {
        dVar8 = 1.0;
        if (iVar1 + -1 + iVar4 <= (d->P).x_max) {
          dVar8 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(iVar1 + -1 + iVar4) - iVar2];
        }
        local_f0 = local_f0 - dVar8;
      }
      dVar8 = 0.0;
      if ((iVar2 <= iVar6) && (iVar6 <= (d->P).x_max)) {
        if (iVar6 == iVar2) {
          dVar8 = *(d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          pdVar3 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar5 = local_e8 + (long)iVar2 * -8;
          dVar8 = *(double *)((long)pdVar3 + lVar7 * 8 + lVar5) -
                  *(double *)((long)pdVar3 + lVar7 * 8 + lVar5 + -8);
        }
      }
      local_f0 = local_f0 - dVar8;
      local_b8._vptr_ITransientExpression = (_func_int **)0x2a8487;
      local_b8.m_isBinaryExpression = true;
      local_b8.m_result = false;
      local_b8._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_c8.line = 0xeb;
      Catch::StringRef::StringRef(&local_88,"diff < 128 * std::numeric_limits<double>::epsilon()");
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b8,&local_c8,local_88,Normal);
      local_d0 = 0x3d20000000000000;
      local_d8 = local_f0;
      Catch::StringRef::StringRef((StringRef *)&local_c8,"<");
      local_b8.m_result = local_d8 < 2.842170943040401e-14;
      local_b8.m_isBinaryExpression = true;
      local_b8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_0031a2f8;
      local_a8 = &local_f0;
      local_a0 = local_c8.file;
      sStack_98 = local_c8.line;
      local_90 = &local_d0;
      Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
      Catch::ITransientExpression::~ITransientExpression(&local_b8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])(local_78.m_resultCapture,&local_78)
        ;
      }
      iVar2 = (d->P).x_min;
      local_f0 = 0.0;
      if ((iVar2 <= (int)local_e0 + iVar4 + 1) && (local_f0 = 1.0, iVar6 < (d->P).x_max)) {
        local_f0 = (d->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[((iVar1 + iVar4) - iVar2) + 1];
      }
      lVar7 = lVar7 + 1;
    } while (local_f0 < 0.95);
  }
  return;
}

Assistant:

void discrete_dist_test_pdf(dist &d) {
  int i{d.min()};
  double P{d.cdf(i)};
  while (P < 0.95) {
    double p{P};
    if (i > d.min())
      p -= d.cdf(i - 1);
    const double diff{p - d.pdf(i)};
    REQUIRE(diff < 128 * std::numeric_limits<double>::epsilon());
    ++i;
    P = d.cdf(i);
  }
}